

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

string * __thiscall
Json::parse_string(string *__return_storage_ptr__,Json *this,string *str,size_t *pos)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (sVar1 = *pos, *pos = sVar1 + 1, (str->_M_dataplus)._M_p[sVar1 + 1] != '\"') {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Json::parse_string(const std::string str, size_t &pos) const {
    std::string res;
    pos++;
    while (str[pos] != '"') {
        res.push_back(str[pos]);
        pos++;
    }
    return res;
}